

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3.hpp
# Opt level: O0

void __thiscall trng::mrg3::jump2(mrg3 *this,uint s)

{
  uint in_ESI;
  int32_t *in_RDI;
  result_type d [3];
  result_type r [3];
  uint i;
  result_type c [9];
  result_type b [9];
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  uint local_6c;
  int32_t local_68 [12];
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  int32_t local_28;
  int32_t local_24;
  int32_t local_20;
  int32_t local_1c;
  int32_t local_18;
  uint local_c;
  
  local_c = in_ESI;
  memset(local_68,0,0x24);
  local_38 = *in_RDI;
  local_34 = in_RDI[1];
  local_30 = in_RDI[2];
  local_2c = 1;
  local_28 = 0;
  local_24 = 0;
  local_20 = 0;
  local_1c = 1;
  local_18 = 0;
  for (local_6c = 0; local_6c < local_c; local_6c = local_6c + 1) {
    int_math::matrix_mult<3>
              ((int32_t (*) [9])&local_38,(int32_t (*) [9])&local_38,(int32_t (*) [9])local_68,
               0x7fffffff);
    local_6c = local_6c + 1;
    if (local_c <= local_6c) break;
    int_math::matrix_mult<3>
              ((int32_t (*) [9])local_68,(int32_t (*) [9])local_68,(int32_t (*) [9])&local_38,
               0x7fffffff);
  }
  local_78 = in_RDI[3];
  local_74 = in_RDI[4];
  local_70 = in_RDI[5];
  if ((local_c & 1) == 0) {
    int_math::matrix_vec_mult<3>
              ((int32_t (*) [9])&local_38,(int32_t (*) [3])&local_78,(int32_t (*) [3])&local_84,
               0x7fffffff);
  }
  else {
    int_math::matrix_vec_mult<3>
              ((int32_t (*) [9])local_68,(int32_t (*) [3])&local_78,(int32_t (*) [3])&local_84,
               0x7fffffff);
  }
  in_RDI[3] = local_84;
  in_RDI[4] = local_80;
  in_RDI[5] = local_7c;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg3::jump2(unsigned int s) {
    result_type b[9], c[9]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = 1;
    b[4] = 0;
    b[5] = 0;
    b[6] = 0;
    b[7] = 1;
    b[8] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<3>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<3>(c, c, b, modulus);
    }
    const result_type r[3]{S.r[0], S.r[1], S.r[2]};
    result_type d[3];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<3>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<3>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
  }